

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O0

void __thiscall CountDownLatch::countDown(CountDownLatch *this)

{
  MutexLock *in_RDI;
  MutexLockGuard lock;
  MutexLockGuard *in_stack_ffffffffffffffe0;
  
  MutexLockGuard::MutexLockGuard(in_stack_ffffffffffffffe0,in_RDI);
  *(int *)((long)&in_RDI[2].mutex + 0x18) = *(int *)((long)&in_RDI[2].mutex + 0x18) + -1;
  if (*(int *)((long)&in_RDI[2].mutex + 0x18) == 0) {
    Condition::notifyAll((Condition *)0x125350);
  }
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x125378);
  return;
}

Assistant:

void CountDownLatch::countDown(){
    MutexLockGuard lock(mutex_);
    --count_;
    if(count_==0) condition_.notifyAll();
}